

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

BinaryExpr<const_(anonymous_namespace)::ns::Project<std::multiset<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>_&,_const_(anonymous_namespace)::ns::Project<std::multiset<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>_&>
* __thiscall
Catch::
ExprLhs<(anonymous_namespace)::ns::Project<std::multiset<(anonymous_namespace)::ns::Value,std::less<(anonymous_namespace)::ns::Value>,std::allocator<(anonymous_namespace)::ns::Value>>>const&>
::operator==(BinaryExpr<const_(anonymous_namespace)::ns::Project<std::multiset<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>_&,_const_(anonymous_namespace)::ns::Project<std::multiset<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>_&>
             *__return_storage_ptr__,
            ExprLhs<(anonymous_namespace)::ns::Project<std::multiset<(anonymous_namespace)::ns::Value,std::less<(anonymous_namespace)::ns::Value>,std::allocator<(anonymous_namespace)::ns::Value>>>const&>
            *this,Project<std::multiset<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>
                  *rhs)

{
  Project<std::multiset<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>
  *pPVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  StringRef local_38;
  
  pPVar1 = *(Project<std::multiset<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>
             **)this;
  if ((pPVar1->version == rhs->version) &&
     (sVar2 = (pPVar1->name)._M_string_length, sVar2 == (rhs->name)._M_string_length)) {
    if (sVar2 != 0) {
      iVar4 = bcmp((pPVar1->name)._M_dataplus._M_p,(rhs->name)._M_dataplus._M_p,sVar2);
      if (iVar4 != 0) goto LAB_00758edb;
    }
    sVar2 = (pPVar1->author)._M_string_length;
    if (sVar2 == (rhs->author)._M_string_length) {
      if (sVar2 != 0) {
        iVar4 = bcmp((pPVar1->author)._M_dataplus._M_p,(rhs->author)._M_dataplus._M_p,sVar2);
        if (iVar4 != 0) goto LAB_00758edb;
      }
      sVar2 = (pPVar1->notes)._M_string_length;
      if (sVar2 == (rhs->notes)._M_string_length) {
        if (sVar2 != 0) {
          iVar4 = bcmp((pPVar1->notes)._M_dataplus._M_p,(rhs->notes)._M_dataplus._M_p,sVar2);
          if (iVar4 != 0) goto LAB_00758edb;
        }
        if (pPVar1->showNotes == rhs->showNotes) {
          bVar3 = std::operator==(&(pPVar1->values)._M_t,&(rhs->values)._M_t);
          goto LAB_00758edd;
        }
      }
    }
  }
LAB_00758edb:
  bVar3 = false;
LAB_00758edd:
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00b75940;
  __return_storage_ptr__->m_lhs = pPVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }